

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

_Bool ewmh_is_normal_window(natwm_state *state,xcb_window_t window)

{
  char cVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  ulong uStack_48;
  xcb_atom_t type;
  size_t i;
  uint local_38;
  uint8_t reply;
  xcb_ewmh_get_atoms_reply_t result;
  xcb_get_property_cookie_t cookie;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  uVar2 = 0x10b224;
  result._reply._4_4_ = window;
  result._reply._0_4_ = xcb_ewmh_get_wm_window_type(state->ewmh,window);
  cVar1 = xcb_ewmh_get_wm_window_type_reply
                    (state->ewmh,result._reply._0_4_,&local_38,0,in_R8,in_R9,uVar2);
  if (cVar1 == '\x01') {
    for (uStack_48 = 0; uStack_48 < local_38; uStack_48 = uStack_48 + 1) {
      if (*(xcb_atom_t *)(result._0_8_ + uStack_48 * 4) != state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL)
      {
        xcb_ewmh_get_atoms_reply_wipe(&local_38);
        return false;
      }
    }
    xcb_ewmh_get_atoms_reply_wipe(&local_38);
  }
  return true;
}

Assistant:

bool ewmh_is_normal_window(const struct natwm_state *state, xcb_window_t window)
{
        xcb_get_property_cookie_t cookie = xcb_ewmh_get_wm_window_type(state->ewmh, window);
        xcb_ewmh_get_atoms_reply_t result;
        uint8_t reply = xcb_ewmh_get_wm_window_type_reply(state->ewmh, cookie, &result, NULL);

        if (reply != 1) {
                // Treat as a normal window
                return true;
        }

        for (size_t i = 0; i < result.atoms_len; ++i) {
                xcb_atom_t type = result.atoms[i];

                // For now we only support normal windows for registering
                if (type != state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL) {
                        xcb_ewmh_get_atoms_reply_wipe(&result);

                        return false;
                }
        }

        xcb_ewmh_get_atoms_reply_wipe(&result);

        return true;
}